

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxColRatio(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  int32_t *piVar1;
  double a;
  byte bVar2;
  int32_t iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  int iVar5;
  Item *pIVar6;
  long lVar7;
  fpclass_type fVar8;
  long lVar9;
  uint *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  long lVar14;
  long in_FS_OFFSET;
  byte bVar15;
  Real a_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_348;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  long local_2b8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b0;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  cpp_dec_float<200U,_int,_void> local_1a0;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar15 = 0;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  local_2b0 = this;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    a = *(double *)(in_FS_OFFSET + -8);
    local_2b8 = 0;
    local_2c0 = lp;
    do {
      pIVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[local_2b8].idx;
      ::soplex::infinity::__tls_init();
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 0x1c;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems[6] = 0;
      local_2a8.data._M_elems[7] = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.data._M_elems[10] = 0;
      local_2a8.data._M_elems[0xb] = 0;
      local_2a8.data._M_elems[0xc] = 0;
      local_2a8.data._M_elems[0xd] = 0;
      local_2a8.data._M_elems[0xe] = 0;
      local_2a8.data._M_elems[0xf] = 0;
      local_2a8.data._M_elems[0x10] = 0;
      local_2a8.data._M_elems[0x11] = 0;
      local_2a8.data._M_elems[0x12] = 0;
      local_2a8.data._M_elems[0x13] = 0;
      local_2a8.data._M_elems[0x14] = 0;
      local_2a8.data._M_elems[0x15] = 0;
      local_2a8.data._M_elems[0x16] = 0;
      local_2a8.data._M_elems[0x17] = 0;
      local_2a8.data._M_elems[0x18] = 0;
      local_2a8.data._M_elems[0x19] = 0;
      local_2a8.data._M_elems._104_5_ = 0;
      local_2a8.data._M_elems[0x1b]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2a8,a);
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 0x1c;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems[8] = 0;
      local_228.data._M_elems[9] = 0;
      local_228.data._M_elems[10] = 0;
      local_228.data._M_elems[0xb] = 0;
      local_228.data._M_elems[0xc] = 0;
      local_228.data._M_elems[0xd] = 0;
      local_228.data._M_elems[0xe] = 0;
      local_228.data._M_elems[0xf] = 0;
      local_228.data._M_elems[0x10] = 0;
      local_228.data._M_elems[0x11] = 0;
      local_228.data._M_elems[0x12] = 0;
      local_228.data._M_elems[0x13] = 0;
      local_228.data._M_elems[0x14] = 0;
      local_228.data._M_elems[0x15] = 0;
      local_228.data._M_elems[0x16] = 0;
      local_228.data._M_elems[0x17] = 0;
      local_228.data._M_elems[0x18] = 0;
      local_228.data._M_elems[0x19] = 0;
      local_228.data._M_elems._104_5_ = 0;
      local_228.data._M_elems[0x1b]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_228,0.0);
      if (0 < (pIVar6->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar14 = 0x7c;
        lVar9 = 0;
        do {
          piVar1 = (int32_t *)
                   ((long)&(((pIVar6->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data + lVar14);
          iVar5 = piVar1[-3];
          bVar2 = *(byte *)(piVar1 + -2);
          fVar8 = piVar1[-1];
          iVar3 = *piVar1;
          memmove(&local_1a0,piVar1 + -0x1f,0x70);
          local_1a0.exp = iVar5;
          local_1a0.neg = (bool)bVar2;
          local_1a0.fpclass = fVar8;
          local_1a0.prec_elem = iVar3;
          if ((bVar2 == 1) && (local_1a0.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite)) {
            local_1a0.neg = false;
          }
          bVar4 = local_1a0.neg;
          pcVar11 = &local_1a0;
          puVar10 = local_a0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar10 = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
            puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
          }
          this_00 = (local_2b0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (local_2b0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a_00 = Tolerances::epsilon(this_00);
          puVar10 = local_a0;
          pcVar11 = &local_120;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar10;
            puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
          }
          local_120.neg = bVar4;
          if ((bVar4 != false) && (local_120.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite)
             ) {
            local_120.neg = (bool)(bVar4 ^ 1);
          }
          bVar4 = false;
          local_120.exp = iVar5;
          local_120.fpclass = fVar8;
          local_120.prec_elem = iVar3;
          if ((fVar8 != cpp_dec_float_NaN) && (!NAN(a_00))) {
            local_348.fpclass = cpp_dec_float_finite;
            local_348.prec_elem = 0x1c;
            local_348.data._M_elems[0] = 0;
            local_348.data._M_elems[1] = 0;
            local_348.data._M_elems[2] = 0;
            local_348.data._M_elems[3] = 0;
            local_348.data._M_elems[4] = 0;
            local_348.data._M_elems[5] = 0;
            local_348.data._M_elems[6] = 0;
            local_348.data._M_elems[7] = 0;
            local_348.data._M_elems[8] = 0;
            local_348.data._M_elems[9] = 0;
            local_348.data._M_elems[10] = 0;
            local_348.data._M_elems[0xb] = 0;
            local_348.data._M_elems[0xc] = 0;
            local_348.data._M_elems[0xd] = 0;
            local_348.data._M_elems[0xe] = 0;
            local_348.data._M_elems[0xf] = 0;
            local_348.data._M_elems[0x10] = 0;
            local_348.data._M_elems[0x11] = 0;
            local_348.data._M_elems[0x12] = 0;
            local_348.data._M_elems[0x13] = 0;
            local_348.data._M_elems[0x14] = 0;
            local_348.data._M_elems[0x15] = 0;
            local_348.data._M_elems[0x16] = 0;
            local_348.data._M_elems[0x17] = 0;
            local_348.data._M_elems[0x18] = 0;
            local_348.data._M_elems[0x19] = 0;
            local_348.data._M_elems._104_5_ = 0;
            local_348.data._M_elems[0x1b]._1_3_ = 0;
            local_348.exp = 0;
            local_348.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_348,a_00);
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_120,&local_348);
            bVar4 = iVar5 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (!bVar4) {
            fVar8 = local_1a0.fpclass;
            if ((local_1a0.fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)
               ) {
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_1a0,&local_2a8);
              fVar8 = local_1a0.fpclass;
              if (iVar5 < 0) {
                pcVar11 = &local_1a0;
                pcVar12 = &local_2a8;
                for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                  (pcVar12->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar11 + (ulong)bVar15 * -8 + 4);
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar15 * -8 + 4);
                }
                local_2a8.exp = local_1a0.exp;
                local_2a8.neg = local_1a0.neg;
                local_2a8.prec_elem = local_1a0.prec_elem;
                local_2a8.fpclass = fVar8;
              }
            }
            if (((fVar8 != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_1a0,&local_228), 0 < iVar5)) {
              pcVar11 = &local_1a0;
              pcVar12 = &local_228;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4)
                ;
              }
              local_228.exp = local_1a0.exp;
              local_228.neg = local_1a0.neg;
              local_228.prec_elem = local_1a0.prec_elem;
              local_228.fpclass = local_1a0.fpclass;
            }
          }
          lVar9 = lVar9 + 1;
          lVar14 = lVar14 + 0x84;
        } while (lVar9 < (pIVar6->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      ::soplex::infinity::__tls_init();
      local_348.fpclass = cpp_dec_float_finite;
      local_348.prec_elem = 0x1c;
      local_348.data._M_elems[0] = 0;
      local_348.data._M_elems[1] = 0;
      local_348.data._M_elems[2] = 0;
      local_348.data._M_elems[3] = 0;
      local_348.data._M_elems[4] = 0;
      local_348.data._M_elems[5] = 0;
      local_348.data._M_elems[6] = 0;
      local_348.data._M_elems[7] = 0;
      local_348.data._M_elems[8] = 0;
      local_348.data._M_elems[9] = 0;
      local_348.data._M_elems[10] = 0;
      local_348.data._M_elems[0xb] = 0;
      local_348.data._M_elems[0xc] = 0;
      local_348.data._M_elems[0xd] = 0;
      local_348.data._M_elems[0xe] = 0;
      local_348.data._M_elems[0xf] = 0;
      local_348.data._M_elems[0x10] = 0;
      local_348.data._M_elems[0x11] = 0;
      local_348.data._M_elems[0x12] = 0;
      local_348.data._M_elems[0x13] = 0;
      local_348.data._M_elems[0x14] = 0;
      local_348.data._M_elems[0x15] = 0;
      local_348.data._M_elems[0x16] = 0;
      local_348.data._M_elems[0x17] = 0;
      local_348.data._M_elems[0x18] = 0;
      local_348.data._M_elems[0x19] = 0;
      local_348.data._M_elems._104_5_ = 0;
      local_348.data._M_elems[0x1b]._1_3_ = 0;
      local_348.exp = 0;
      local_348.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_348,a);
      lp = local_2c0;
      if (((local_2a8.fpclass == cpp_dec_float_NaN) || (local_348.fpclass == cpp_dec_float_NaN)) ||
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2a8,&local_348), iVar5 != 0)) {
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 0x1c;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems[6] = 0;
        local_348.data._M_elems[7] = 0;
        local_348.data._M_elems[8] = 0;
        local_348.data._M_elems[9] = 0;
        local_348.data._M_elems[10] = 0;
        local_348.data._M_elems[0xb] = 0;
        local_348.data._M_elems[0xc] = 0;
        local_348.data._M_elems[0xd] = 0;
        local_348.data._M_elems[0xe] = 0;
        local_348.data._M_elems[0xf] = 0;
        local_348.data._M_elems[0x10] = 0;
        local_348.data._M_elems[0x11] = 0;
        local_348.data._M_elems[0x12] = 0;
        local_348.data._M_elems[0x13] = 0;
        local_348.data._M_elems[0x14] = 0;
        local_348.data._M_elems[0x15] = 0;
        local_348.data._M_elems[0x16] = 0;
        local_348.data._M_elems[0x17] = 0;
        local_348.data._M_elems[0x18] = 0;
        local_348.data._M_elems[0x19] = 0;
        local_348.data._M_elems._104_5_ = 0;
        local_348.data._M_elems[0x1b]._1_3_ = 0;
        local_348.exp = 0;
        local_348.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_348,&local_228,&local_2a8);
        if (((local_348.fpclass != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_348,&__return_storage_ptr__->m_backend), 0 < iVar5)) {
          pcVar11 = &local_348;
          pnVar13 = __return_storage_ptr__;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar13->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
          }
          (__return_storage_ptr__->m_backend).exp = local_348.exp;
          (__return_storage_ptr__->m_backend).neg = local_348.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_348.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_348.prec_elem;
        }
      }
      local_2b8 = local_2b8 + 1;
    } while (local_2b8 <
             (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxColRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nCols(); ++i)
   {
      const SVectorBase<R>& vec  = lp.colVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}